

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O0

void PrepareMapToPalette(uint32_t *palette,uint32_t num_colors,uint32_t *sorted,uint32_t *idx_map)

{
  int iVar1;
  long in_RCX;
  uint32_t *in_RDX;
  uint in_ESI;
  void *in_RDI;
  uint32_t i;
  uint local_24;
  
  memcpy(in_RDX,in_RDI,(ulong)in_ESI << 2);
  qsort(in_RDX,(ulong)in_ESI,4,PaletteCompareColorsForQsort);
  for (local_24 = 0; local_24 < in_ESI; local_24 = local_24 + 1) {
    iVar1 = SearchColorNoIdx(in_RDX,*(uint32_t *)((long)in_RDI + (ulong)local_24 * 4),in_ESI);
    *(uint *)(in_RCX + (long)iVar1 * 4) = local_24;
  }
  return;
}

Assistant:

void PrepareMapToPalette(const uint32_t palette[], uint32_t num_colors,
                         uint32_t sorted[], uint32_t idx_map[]) {
  uint32_t i;
  memcpy(sorted, palette, num_colors * sizeof(*sorted));
  qsort(sorted, num_colors, sizeof(*sorted), PaletteCompareColorsForQsort);
  for (i = 0; i < num_colors; ++i) {
    idx_map[SearchColorNoIdx(sorted, palette[i], num_colors)] = i;
  }
}